

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_hotspot.cxx
# Opt level: O3

void __thiscall Fl_Window::hotspot(Fl_Window *this,Fl_Widget *o,int offscreen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int X;
  int Y;
  
  uVar1 = o->w_;
  uVar3 = o->h_;
  X = (int)uVar1 / 2;
  Y = (int)uVar3 / 2;
  if (o != (Fl_Widget *)0x0 && (Fl_Window *)o != this) {
    do {
      uVar2 = (((Fl_Window *)o)->super_Fl_Group).super_Fl_Widget.x_;
      uVar4 = (((Fl_Window *)o)->super_Fl_Group).super_Fl_Widget.y_;
      X = uVar2 + X;
      Y = uVar4 + Y;
      o = (Fl_Widget *)Fl_Widget::window(o);
      if ((Fl_Window *)o == this) break;
    } while ((Fl_Window *)o != (Fl_Window *)0x0);
  }
  hotspot(this,X,Y,offscreen);
  return;
}

Assistant:

void Fl_Window::hotspot(const Fl_Widget *o, int offscreen) {
  int X = o->w()/2;
  int Y = o->h()/2;
  while (o != this && o) {
    X += o->x(); Y += o->y();
    o = o->window();
  }
  hotspot(X,Y,offscreen);
}